

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefSparse.cpp
# Opt level: O1

double __thiscall
JointBeliefSparse::UpdateSlow
          (JointBeliefSparse *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI,
          Index newJOI)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined4 *puVar4;
  container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  cVar5;
  char cVar6;
  long lVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  undefined1 *puVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double Pso_ba;
  BSit it;
  double local_e0;
  double local_d8;
  value_type local_d0;
  undefined4 *local_c8;
  Index local_bc;
  sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  local_b8;
  undefined4 *local_a0;
  undefined1 local_98 [32];
  ulong local_78;
  unsigned_long *local_70;
  new_allocator<double> local_68 [8];
  size_type local_60;
  double *local_58;
  undefined1 *local_50;
  container_type *local_48;
  undefined4 *local_38;
  undefined1 extraout_var [56];
  
  local_a0 = *(undefined4 **)(&this->field_0x8 + *(long *)(*(long *)this + -0xd8));
  local_98._8_8_ = ZEXT18(local_a0 != (undefined4 *)0x0);
  local_98._16_8_ = 0;
  local_bc = newJOI;
  local_98._0_8_ = local_a0;
  local_78 = local_98._8_8_;
  if (local_a0 == (undefined4 *)0x0) {
    local_70 = (unsigned_long *)0x0;
  }
  else {
    local_70 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(local_98 + 0x18),local_98._8_8_,
                          (void *)0x0);
  }
  local_60 = local_98._8_8_;
  if (local_98._8_8_ == 0) {
    local_58 = (double *)0x0;
  }
  else {
    local_58 = __gnu_cxx::new_allocator<double>::allocate(local_68,local_98._8_8_,(void *)0x0);
  }
  cVar6 = (**(code **)((long)*pu + 0x140))(pu);
  local_e0 = 0.0;
  if (local_a0 != (undefined4 *)0x0) {
    puVar10 = &this->field_0x8;
    puVar8 = (undefined4 *)0x0;
    local_e0 = 0.0;
    local_50 = puVar10;
    do {
      local_d0 = 0.0;
      local_c8 = puVar8;
      if (cVar6 == '\0') {
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)(puVar10 + *(long *)(*(long *)this + -0xd8)),0);
        cVar5.c_ = local_b8.
                   super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                   .c_;
        local_d8 = 0.0;
        puVar9 = (undefined4 *)local_b8.i_;
        for (puVar8 = (undefined4 *)local_b8.i_;
            boost::numeric::ublas::
            compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)(puVar10 + *(long *)(*(long *)this + -0xd8)),
                   *(size_type *)(&this->field_0x8 + *(long *)(*(long *)this + -0xd8))),
            puVar8 != (undefined4 *)local_b8.i_; puVar8 = puVar8 + 2) {
          auVar14._0_8_ = (**(code **)((long)*pu + 0x108))(pu,*puVar8,lastJAI,local_c8);
          auVar14._8_56_ = extraout_var;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_d8;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(((long)((cVar5.c_)->value_data_).data_ -
                                    (long)((cVar5.c_)->index_data_).data_) + (long)puVar9);
          auVar3 = vfmadd231sd_fma(auVar16,auVar14._0_16_,auVar3);
          local_d8 = auVar3._0_8_;
          puVar9 = puVar9 + 2;
        }
        if (0.0 < local_d8) {
          local_d0 = (value_type)(**(code **)((long)*pu + 0x118))(pu,lastJAI,local_c8,local_bc);
          local_d0 = local_d0 * local_d8;
        }
      }
      else {
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)(puVar10 + *(long *)(*(long *)this + -0xd8)),0);
        local_48 = local_b8.
                   super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                   .c_;
        puVar8 = (undefined4 *)local_b8.i_;
        for (puVar9 = (undefined4 *)local_b8.i_;
            boost::numeric::ublas::
            compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)(puVar10 + *(long *)(*(long *)this + -0xd8)),
                   *(size_type *)(&this->field_0x8 + *(long *)(*(long *)this + -0xd8))),
            puVar4 = local_c8, puVar9 != (undefined4 *)local_b8.i_; puVar9 = puVar9 + 2) {
          dVar11 = (double)(**(code **)((long)*pu + 0x120))
                                     (pu,*puVar9,lastJAI,(ulong)local_c8 & 0xffffffff,local_bc);
          dVar12 = (double)(**(code **)((long)*pu + 0x108))
                                     (pu,*puVar9,lastJAI,(ulong)puVar4 & 0xffffffff);
          auVar15._8_8_ = 0;
          auVar15._0_8_ =
               *(ulong *)(((long)(local_48->value_data_).data_ - (long)(local_48->index_data_).data_
                          ) + (long)puVar8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_d0;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar12 * dVar11;
          auVar3 = vfmadd213sd_fma(auVar15,auVar13,auVar1);
          local_d0 = auVar3._0_8_;
          puVar8 = puVar8 + 2;
          puVar10 = local_50;
        }
      }
      puVar8 = local_c8;
      if (1e-12 < local_d0) {
        local_b8.
        super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        .c_ = (container_type *)local_98;
        local_b8.i_ = (size_type)local_c8;
        boost::numeric::ublas::
        sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        ::set(&local_b8,&local_d0);
        local_e0 = local_e0 + local_d0;
      }
      puVar8 = (undefined4 *)(ulong)((int)puVar8 + 1);
    } while (puVar8 < local_a0);
  }
  if (0.0 < local_e0) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)local_98,0);
    while (boost::numeric::ublas::
           compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)local_98,local_98._0_8_), (undefined4 *)local_b8.i_ != local_38) {
      lVar7 = local_b8.i_ -
              (long)((local_b8.
                      super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     .c_)->index_data_).data_;
      pdVar2 = ((local_b8.
                 super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                .c_)->value_data_).data_;
      *(double *)((long)pdVar2 + lVar7) = *(double *)((long)pdVar2 + lVar7) / local_e0;
      local_b8.i_ = local_b8.i_ + 8;
    }
  }
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::operator=((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)(&this->field_0x8 + *(long *)(*(long *)this + -0xd8)),
              (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)local_98);
  if (local_60 != 0) {
    operator_delete(local_58,local_60 << 3);
  }
  if (local_78 != 0) {
    operator_delete(local_70,local_78 << 3);
  }
  return local_e0;
}

Assistant:

double JointBeliefSparse::UpdateSlow(const MultiAgentDecisionProcessDiscreteInterface &pu,
                                     Index lastJAI, Index newJOI)
{
    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    double Ps_ba, Po_as, Pso_ba;
    size_t nrS = _m_b.size();
    BS newJB_unnorm(nrS);
    bool isEventDriven = pu.GetEventObservability();
    for(Index sI=0; sI < nrS; sI++)
    {
        Pso_ba = 0;
        
        if(!isEventDriven)
        {
            //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
            Ps_ba = 0.0;

            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                Ps_ba += pu.GetTransitionProbability(it.index(), lastJAI, sI) * *it;
            
            if(Ps_ba>0) // if it is zero, Pso_ba will be zero anyway
            {
                //P(newJOI | lastJAI, sI) :
                Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);

                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
        }
        else
        {
            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                Pso_ba += pu.GetObservationProbability(it.index(), lastJAI, sI, newJOI) * 
                          pu.GetTransitionProbability(it.index(), lastJAI, sI) * *it;
        }
        
        if(Pso_ba>PROB_PRECISION) // we don't want to store very
                                  // small probabilities in a
                                  // sparse representation
        {
            newJB_unnorm[sI]=Pso_ba; //unnormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
    }
    
    //normalize:    
    if(Po_ba>0)
        for(BSit it=newJB_unnorm.begin(); it!=newJB_unnorm.end(); ++it)
            *it/=Po_ba;

    _m_b=newJB_unnorm;

#if JointBeliefSparse_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBeliefSparse::UpdateSlow SanityCheck failed"));
#endif

    return(Po_ba);
}